

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1591.c
# Opt level: O3

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  
  sVar1 = consumed;
  sVar2 = strlen(data);
  uVar3 = sVar2 - sVar1;
  if (uVar3 == 0) {
    __n = 0;
  }
  else {
    __n = nmemb * size;
    if (uVar3 <= __n && __n - uVar3 != 0) {
      __n = sVar2;
    }
    consumed = sVar1 + __n;
    memcpy(ptr,data,__n);
  }
  return __n;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */

  if(consumed == strlen(data)) {
    return 0;
  }

  if(amount > strlen(data)-consumed) {
    amount = strlen(data);
  }

  consumed += amount;
  (void)stream;
  memcpy(ptr, data, amount);
  return amount;
}